

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Identifier.h
# Opt level: O3

bool __thiscall soul::Identifier::operator==(Identifier *this,string_view other)

{
  string *psVar1;
  bool bVar2;
  int iVar3;
  size_t __n;
  
  __n = other._M_len;
  psVar1 = this->name;
  if (psVar1 == (string *)0x0) {
    throwInternalCompilerError("isValid()","operator==",0x28);
  }
  if (psVar1->_M_string_length == __n) {
    if (__n != 0) {
      iVar3 = bcmp((psVar1->_M_dataplus)._M_p,other._M_str,__n);
      if (iVar3 != 0) goto LAB_001c2299;
    }
    bVar2 = true;
  }
  else {
LAB_001c2299:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool operator== (std::string_view other) const                  { SOUL_ASSERT (isValid()); return *name == other; }